

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O0

int main(void)

{
  byte bVar1;
  char cVar2;
  ostream *poVar3;
  uint thresh_sens_val;
  undefined1 local_6b0 [7];
  char key;
  allocator local_691;
  string local_690 [32];
  _InputArray local_670;
  allocator local_651;
  string local_650 [32];
  Scalar_<double> local_630;
  Scalar_<double> local_610;
  Scalar_<double> local_5f0;
  Scalar local_5d0 [3];
  undefined1 local_570 [120];
  _InputArray local_4f8;
  Ptr<cv::BackgroundSubtractor> local_4e0;
  Mat local_4d0 [96];
  Mat local_470 [96];
  _OutputArray local_410;
  _InputArray local_3f8;
  _OutputArray local_3e0;
  _InputArray local_3c8;
  int local_3b0;
  byte local_3a9;
  int bgs_learnNFrames;
  bool bgs_learn;
  undefined1 local_398 [8];
  Ptr<cv::BackgroundSubtractor> bgs;
  Scalar upper;
  Scalar lower;
  Mat mask;
  Mat local_2e8 [8];
  Mat imgYCrCb;
  Mat local_288 [8];
  Mat blur;
  undefined1 local_228 [8];
  Mat img;
  Mat local_1c8 [8];
  Mat frame;
  VideoCapture local_158 [8];
  VideoCapture cap;
  undefined1 local_128 [8];
  HandDetector hd;
  
  hd.lastHands.super__Vector_base<ShortHand,_std::allocator<ShortHand>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  HandDetector::HandDetector((HandDetector *)local_128);
  cv::VideoCapture::VideoCapture(local_158,0,0);
  bVar1 = cv::VideoCapture::isOpened();
  if ((bVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Cannot open video capture");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    hd.lastHands.super__Vector_base<ShortHand,_std::allocator<ShortHand>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    cv::Mat::Mat(local_1c8);
    cv::Mat::Mat((Mat *)local_228);
    cv::Mat::Mat(local_288);
    cv::Mat::Mat(local_2e8);
    cv::Mat::Mat((Mat *)(lower.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 3));
    cv::Scalar_<double>::Scalar_
              ((Scalar_<double> *)(upper.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 3),0.0,
               135.0,90.0,0.0);
    cv::Scalar_<double>::Scalar_
              ((Scalar_<double> *)
               &bgs.super_shared_ptr<cv::BackgroundSubtractor>.
                super___shared_ptr<cv::BackgroundSubtractor,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,255.0,230.0,150.0,0.0);
    cv::createBackgroundSubtractorMOG2((int)&bgs_learnNFrames,16.0,true);
    cv::Ptr<cv::BackgroundSubtractor>::Ptr<cv::BackgroundSubtractorMOG2>
              ((Ptr<cv::BackgroundSubtractor> *)local_398,
               (Ptr<cv::BackgroundSubtractorMOG2> *)&bgs_learnNFrames);
    cv::Ptr<cv::BackgroundSubtractorMOG2>::~Ptr
              ((Ptr<cv::BackgroundSubtractorMOG2> *)&bgs_learnNFrames);
    local_3a9 = 1;
    local_3b0 = 100;
    while (bVar1 = cv::VideoCapture::isOpened(), (bVar1 & 1) != 0) {
      cv::VideoCapture::operator>>(local_158,local_1c8);
      cv::_InputArray::_InputArray(&local_3c8,local_1c8);
      cv::_OutputArray::_OutputArray(&local_3e0,local_1c8);
      cv::flip(&local_3c8,&local_3e0,0);
      cv::_OutputArray::~_OutputArray(&local_3e0);
      cv::_InputArray::~_InputArray(&local_3c8);
      cv::_InputArray::_InputArray(&local_3f8,local_1c8);
      cv::_OutputArray::_OutputArray(&local_410,local_1c8);
      cv::flip(&local_3f8,&local_410,1);
      cv::_OutputArray::~_OutputArray(&local_410);
      cv::_InputArray::~_InputArray(&local_3f8);
      cv::Mat::Mat(local_4d0,local_1c8);
      cv::Ptr<cv::BackgroundSubtractor>::Ptr(&local_4e0,(Ptr<cv::BackgroundSubtractor> *)local_398);
      thresh_sens_val = local_3a9 & 1;
      deleteBg(local_470,local_4d0,(Ptr<cv::BackgroundSubtractor> *)local_228,SUB81(&local_4e0,0),
               thresh_sens_val);
      cv::Mat::~Mat(local_470);
      cv::Ptr<cv::BackgroundSubtractor>::~Ptr(&local_4e0);
      cv::Mat::~Mat(local_4d0);
      cv::_InputArray::_InputArray(&local_4f8,(Mat *)local_228);
      cv::_OutputArray::_OutputArray((_OutputArray *)(local_570 + 0x60),local_2e8);
      cv::cvtColor((cv *)&local_4f8,(_InputArray *)(local_570 + 0x60),(_OutputArray *)0x24,0,
                   thresh_sens_val);
      cv::_OutputArray::~_OutputArray((_OutputArray *)(local_570 + 0x60));
      cv::_InputArray::~_InputArray(&local_4f8);
      cv::Mat::Mat((Mat *)local_5d0,local_2e8);
      cv::Scalar_<double>::Scalar_
                (&local_5f0,
                 (Scalar_<double> *)(upper.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 3));
      cv::Scalar_<double>::Scalar_
                (&local_610,
                 (Scalar_<double> *)
                 &bgs.super_shared_ptr<cv::BackgroundSubtractor>.
                  super___shared_ptr<cv::BackgroundSubtractor,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      HandDetector::detectHands_range
                ((HandDetector *)local_570,(Mat *)local_128,local_5d0,&local_5f0);
      cv::Mat::operator=((Mat *)(lower.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 3),
                         (Mat *)local_570);
      cv::Mat::~Mat((Mat *)local_570);
      cv::Mat::~Mat((Mat *)local_5d0);
      HandDetector::getFingers((HandDetector *)local_128);
      HandDetector::initFilters((HandDetector *)local_128);
      HandDetector::updateFilters((HandDetector *)local_128);
      HandDetector::stabilize((HandDetector *)local_128);
      HandDetector::getHigherFingers((HandDetector *)local_128);
      HandDetector::getFarthestFingers((HandDetector *)local_128);
      cv::Scalar_<double>::Scalar_(&local_630,255.0,0.0,100.0,0.0);
      HandDetector::drawHands((HandDetector *)local_128,local_1c8,&local_630,2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_650,"hands",&local_651);
      cv::_InputArray::_InputArray(&local_670,local_1c8);
      cv::imshow(local_650,&local_670);
      cv::_InputArray::~_InputArray(&local_670);
      std::__cxx11::string::~string(local_650);
      std::allocator<char>::~allocator((allocator<char> *)&local_651);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_690,"mask",&local_691);
      cv::_InputArray::_InputArray
                ((_InputArray *)local_6b0,
                 (Mat *)(lower.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 3));
      cv::imshow(local_690,(_InputArray *)local_6b0);
      cv::_InputArray::~_InputArray((_InputArray *)local_6b0);
      std::__cxx11::string::~string(local_690);
      std::allocator<char>::~allocator((allocator<char> *)&local_691);
      HandDetector::updateLast((HandDetector *)local_128);
      if (local_3b0 < 1) {
        if ((local_3a9 & 1) != 0) {
          local_3a9 = 0;
          poVar3 = std::operator<<((ostream *)&std::cout,"Background learned");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
      }
      else {
        local_3b0 = local_3b0 + -1;
      }
      cVar2 = cv::waitKey(1);
      if (cVar2 != -1) {
        if (cVar2 == 'b') {
          local_3b0 = 100;
          local_3a9 = 1;
          poVar3 = std::operator<<((ostream *)&std::cout,"Starting learning background.");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
        else {
          if (cVar2 == 'q') {
            poVar3 = std::operator<<((ostream *)&std::cout,"exit");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            break;
          }
          printf("Key pressed: %c\n",(ulong)(uint)(int)cVar2);
        }
      }
    }
    hd.lastHands.super__Vector_base<ShortHand,_std::allocator<ShortHand>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    cv::Ptr<cv::BackgroundSubtractor>::~Ptr((Ptr<cv::BackgroundSubtractor> *)local_398);
    cv::Mat::~Mat((Mat *)(lower.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 3));
    cv::Mat::~Mat(local_2e8);
    cv::Mat::~Mat(local_288);
    cv::Mat::~Mat((Mat *)local_228);
    cv::Mat::~Mat(local_1c8);
  }
  cv::VideoCapture::~VideoCapture(local_158);
  HandDetector::~HandDetector((HandDetector *)local_128);
  return hd.lastHands.super__Vector_base<ShortHand,_std::allocator<ShortHand>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main()
{
    HandDetector hd;
    VideoCapture cap(0);
    if (!cap.isOpened()) {
        cerr << "Cannot open video capture" << endl;
        return EXIT_FAILURE;
    }

    Mat frame, img, blur, imgYCrCb, mask;

    Scalar lower = Scalar(0, 135, 90);
    Scalar upper = Scalar(255, 230, 150);

    Ptr<BackgroundSubtractor> bgs = createBackgroundSubtractorMOG2();
    bool bgs_learn = true;
    int bgs_learnNFrames = 100;

    while (cap.isOpened()) {
        cap >> frame;
        flip(frame, frame, 0);
        flip(frame, frame, 1);

        deleteBg(frame, img, bgs, bgs_learn, hd.thresh_sens_val);
        cvtColor(img, imgYCrCb, COLOR_BGR2YCrCb);
        mask = hd.detectHands_range(imgYCrCb, lower, upper);
        hd.getFingers();

        hd.initFilters();
        hd.updateFilters();
        hd.stabilize();

        hd.getHigherFingers();
        hd.getFarthestFingers();

        hd.drawHands(frame, Scalar(255, 0, 100), 2);

        imshow("hands", frame);
        imshow("mask", mask);

        hd.updateLast();

        if (bgs_learnNFrames > 0)
            bgs_learnNFrames--;
        else if (bgs_learn) {
            bgs_learn = false;
            cout << "Background learned" << endl;
        }

        char key = waitKey(1);
        if (key != -1) {
            switch (key) {
                case 'q': // exit
                    cout << "exit" << endl;
                    return EXIT_SUCCESS;
                case 'b': // change bg
                    bgs_learnNFrames = 100;
                    bgs_learn = true;
                    cout << "Starting learning background." << endl;
                    break;
                default:
                    printf("Key pressed: %c\n", key);
                    break;
            }
        }
    }
    return EXIT_SUCCESS;
}